

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureUnitTests::init(TextureUnitTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  Context *context;
  CaseType caseType_00;
  undefined4 numUnits_00;
  deUint32 randSeed;
  TestNode *pTVar1;
  char *pcVar2;
  TextureUnitCase *this_00;
  TextureUnitTests *pTVar3;
  TestCaseGroup *local_f8;
  TestCaseGroup *local_f0;
  string local_c0;
  int local_9c;
  TestNode *pTStack_98;
  int testNdx;
  TestCaseGroup *caseTypeGroup;
  char *caseTypeGroupName;
  TestNode *pTStack_80;
  int caseType;
  TestCaseGroup *countGroup;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string countGroupName;
  uint local_18;
  int numUnits;
  int unitCountNdx;
  int numTestsPerGroup;
  TextureUnitTests *this_local;
  
  local_18 = 0;
  pTVar3 = this;
  while ((int)local_18 < 4) {
    countGroupName.field_2._12_4_ = init::unitCounts[(int)local_18];
    local_62 = 0;
    if (init::unitCounts[(int)local_18] < 0) {
      std::allocator<char>::allocator();
      local_62 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"all",&local_61);
    }
    else {
      de::toString<int>(&local_60,(int *)(countGroupName.field_2._M_local_buf + 0xc));
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,"_units");
    std::__cxx11::string::~string((string *)&local_60);
    if ((local_62 & 1) != 0) {
      std::allocator<char>::~allocator(&local_61);
    }
    pTVar1 = (TestNode *)operator_new(0x70);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,testCtx,pcVar2,"");
    pTStack_80 = pTVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    for (caseTypeGroupName._4_4_ = CASE_ONLY_2D; (int)caseTypeGroupName._4_4_ < 3;
        caseTypeGroupName._4_4_ = caseTypeGroupName._4_4_ + CASE_ONLY_CUBE) {
      if (caseTypeGroupName._4_4_ == CASE_ONLY_2D) {
        local_f0 = (TestCaseGroup *)0xad1295;
      }
      else {
        if (caseTypeGroupName._4_4_ == CASE_ONLY_CUBE) {
          local_f8 = (TestCaseGroup *)0xad129d;
        }
        else {
          local_f8 = (TestCaseGroup *)0x0;
          if (caseTypeGroupName._4_4_ == CASE_MIXED) {
            local_f8 = (TestCaseGroup *)0xae54dc;
          }
        }
        local_f0 = local_f8;
      }
      caseTypeGroup = local_f0;
      pTVar1 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar1,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 (char *)caseTypeGroup,"");
      pTStack_98 = pTVar1;
      tcu::TestNode::addChild(pTStack_80,pTVar1);
      for (local_9c = 0; pTVar1 = pTStack_98, local_9c < 10; local_9c = local_9c + 1) {
        this_00 = (TextureUnitCase *)operator_new(0x128);
        context = (this->super_TestCaseGroup).m_context;
        de::toString<int>(&local_c0,&local_9c);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        numUnits_00 = countGroupName.field_2._12_4_;
        caseType_00 = caseTypeGroupName._4_4_;
        randSeed = deInt32Hash(local_9c);
        TextureUnitCase::TextureUnitCase(this_00,context,pcVar2,"",numUnits_00,caseType_00,randSeed)
        ;
        tcu::TestNode::addChild(pTVar1,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
    std::__cxx11::string::~string((string *)local_40);
    local_18 = local_18 + 1;
    pTVar3 = (TextureUnitTests *)(ulong)local_18;
  }
  return (int)pTVar3;
}

Assistant:

void TextureUnitTests::init (void)
{
	const int numTestsPerGroup = 10;

	static const int unitCounts[] =
	{
		2,
		4,
		8,
		-1 // \note Negative stands for the implementation-specified maximum.
	};

	for (int unitCountNdx = 0; unitCountNdx < DE_LENGTH_OF_ARRAY(unitCounts); unitCountNdx++)
	{
		int numUnits = unitCounts[unitCountNdx];

		string countGroupName = (unitCounts[unitCountNdx] < 0 ? "all" : de::toString(numUnits)) + "_units";

		tcu::TestCaseGroup* countGroup = new tcu::TestCaseGroup(m_testCtx, countGroupName.c_str(), "");
		addChild(countGroup);

		DE_STATIC_ASSERT((int)TextureUnitCase::CASE_ONLY_2D == 0);

		for (int caseType = (int)TextureUnitCase::CASE_ONLY_2D; caseType < (int)TextureUnitCase::CASE_LAST; caseType++)
		{
			const char* caseTypeGroupName = (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_2D	? "only_2d" :
											(TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_CUBE	? "only_cube" :
											(TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_MIXED		? "mixed" :
																													  DE_NULL;
			DE_ASSERT(caseTypeGroupName != DE_NULL);

			tcu::TestCaseGroup* caseTypeGroup = new tcu::TestCaseGroup(m_testCtx, caseTypeGroupName, "");
			countGroup->addChild(caseTypeGroup);

			for (int testNdx = 0; testNdx < numTestsPerGroup; testNdx++)
				caseTypeGroup->addChild(new TextureUnitCase(m_context, de::toString(testNdx).c_str(), "", numUnits, (TextureUnitCase::CaseType)caseType, (deUint32)deInt32Hash(testNdx)));
		}
	}
}